

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O3

bool __thiscall
ByteCodeGenerator::EnsureSymbolModuleSlots(ByteCodeGenerator *this,Symbol *sym,FuncInfo *funcInfo)

{
  short sVar1;
  JavascriptLibrary *this_00;
  code *pcVar2;
  bool bVar3;
  PropertyId exportNameId;
  PropertyId localName;
  int iVar4;
  uint uVar5;
  ModuleNameRecord *in_RAX;
  undefined4 *puVar6;
  SourceTextModuleRecord *this_01;
  uint moduleId;
  ModuleNameRecord *local_38;
  ModuleNameRecord *moduleNameRecord;
  
  local_38 = in_RAX;
  if ((sym->field_0x43 & 0x40) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0xf20,"(sym->GetIsModuleExportStorage())","sym->GetIsModuleExportStorage()")
    ;
    if (!bVar3) goto LAB_008096e0;
    *puVar6 = 0;
  }
  if ((sym->moduleIndex == -1) || (sym->scopeSlot == -1)) {
    this_00 = (this->scriptContext->super_ScriptContextBase).javascriptLibrary;
    Js::JavascriptLibrary::EnsureModuleRecordList(this_00);
    moduleId = ((this->m_utf8SourceInfo->m_srcInfo).ptr)->moduleID;
    this_01 = Js::JavascriptLibrary::GetModuleRecord(this_00,moduleId);
    sVar1 = *(short *)&sym->field_0x42;
    localName = Symbol::EnsurePosition(sym,funcInfo);
    if (sVar1 < 0) {
      local_38 = (ModuleNameRecord *)0x0;
      bVar3 = Js::SourceTextModuleRecord::ResolveImport(this_01,localName,&local_38);
      if (!bVar3) {
        return false;
      }
      if (local_38 == (ModuleNameRecord *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0xf36,"(moduleNameRecord != nullptr)","moduleNameRecord != nullptr");
        if (!bVar3) goto LAB_008096e0;
        *puVar6 = 0;
      }
      iVar4 = (*(((local_38->module).ptr)->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0xd])();
      if ((char)iVar4 == '\0') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0xf37,"(moduleNameRecord->module->IsSourceTextModuleRecord())",
                           "moduleNameRecord->module->IsSourceTextModuleRecord()");
        if (!bVar3) {
LAB_008096e0:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar6 = 0;
      }
      this_01 = (SourceTextModuleRecord *)(local_38->module).ptr;
      moduleId = this_01->moduleId;
      localName = local_38->bindingName;
    }
    uVar5 = Js::SourceTextModuleRecord::GetLocalExportSlotIndexByLocalName(this_01,localName);
    sym->moduleIndex = moduleId;
    sym->scopeSlot = uVar5;
  }
  return true;
}

Assistant:

bool ByteCodeGenerator::EnsureSymbolModuleSlots(Symbol* sym, FuncInfo* funcInfo)
{
    Assert(sym->GetIsModuleExportStorage());

    if (sym->GetModuleIndex() != Js::Constants::NoProperty && sym->GetScopeSlot() != Js::Constants::NoProperty)
    {
        return true;
    }

    Js::JavascriptLibrary* library = this->GetScriptContext()->GetLibrary();
    library->EnsureModuleRecordList();
    uint moduleIndex = this->GetModuleID();
    uint moduleSlotIndex;
    Js::SourceTextModuleRecord* moduleRecord = library->GetModuleRecord(moduleIndex);

    if (sym->GetIsModuleImport())
    {
        Js::PropertyId localImportNameId = sym->EnsurePosition(funcInfo);
        Js::ModuleNameRecord* moduleNameRecord = nullptr;
        if (!moduleRecord->ResolveImport(localImportNameId, &moduleNameRecord))
        {
            return false;
        }

        AnalysisAssert(moduleNameRecord != nullptr);
        Assert(moduleNameRecord->module->IsSourceTextModuleRecord());
        Js::SourceTextModuleRecord* resolvedModuleRecord =
            (Js::SourceTextModuleRecord*)PointerValue(moduleNameRecord->module);

        moduleIndex = resolvedModuleRecord->GetModuleId();
        moduleSlotIndex = resolvedModuleRecord->GetLocalExportSlotIndexByLocalName(moduleNameRecord->bindingName);
    }
    else
    {
        Js::PropertyId exportNameId = sym->EnsurePosition(funcInfo);
        moduleSlotIndex = moduleRecord->GetLocalExportSlotIndexByLocalName(exportNameId);
    }

    sym->SetModuleIndex(moduleIndex);
    sym->SetScopeSlot(moduleSlotIndex);

    return true;
}